

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *tokenStart)

{
  iterator *piVar1;
  ushort uVar2;
  ValueHolder *pVVar3;
  TokenType TVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  Value *pVVar8;
  long *plVar9;
  _Elt_pointer ppVVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  byte unaff_R13B;
  ushort uVar12;
  Value numberName;
  Token comma;
  string name;
  Value init;
  Token colon;
  Token tokenName;
  ValueHolder local_f0;
  ulong local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined8 local_d0;
  string local_c8;
  string local_a8;
  ValueHolder local_88;
  ushort local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  Token local_60;
  Token local_48;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  uVar12 = local_80 & 0xfe00;
  local_80 = uVar12 + 7;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  pcVar7 = (char *)operator_new(0x30);
  pcVar7[0x10] = '\0';
  pcVar7[0x11] = '\0';
  pcVar7[0x12] = '\0';
  pcVar7[0x13] = '\0';
  pcVar7[0x14] = '\0';
  pcVar7[0x15] = '\0';
  pcVar7[0x16] = '\0';
  pcVar7[0x17] = '\0';
  pcVar7[0x18] = '\0';
  pcVar7[0x19] = '\0';
  pcVar7[0x1a] = '\0';
  pcVar7[0x1b] = '\0';
  pcVar7[0x1c] = '\0';
  pcVar7[0x1d] = '\0';
  pcVar7[0x1e] = '\0';
  pcVar7[0x1f] = '\0';
  pcVar7[0x20] = '\0';
  pcVar7[0x21] = '\0';
  pcVar7[0x22] = '\0';
  pcVar7[0x23] = '\0';
  pcVar7[0x24] = '\0';
  pcVar7[0x25] = '\0';
  pcVar7[0x26] = '\0';
  pcVar7[0x27] = '\0';
  pcVar7[0x28] = '\0';
  pcVar7[0x29] = '\0';
  pcVar7[0x2a] = '\0';
  pcVar7[0x2b] = '\0';
  pcVar7[0x2c] = '\0';
  pcVar7[0x2d] = '\0';
  pcVar7[0x2e] = '\0';
  pcVar7[0x2f] = '\0';
  pcVar7[0] = '\0';
  pcVar7[1] = '\0';
  pcVar7[2] = '\0';
  pcVar7[3] = '\0';
  pcVar7[4] = '\0';
  pcVar7[5] = '\0';
  pcVar7[6] = '\0';
  pcVar7[7] = '\0';
  pcVar7[8] = '\0';
  pcVar7[9] = '\0';
  pcVar7[10] = '\0';
  pcVar7[0xb] = '\0';
  pcVar7[0xc] = '\0';
  pcVar7[0xd] = '\0';
  pcVar7[0xe] = '\0';
  pcVar7[0xf] = '\0';
  *(char **)(pcVar7 + 0x18) = pcVar7 + 8;
  *(char **)(pcVar7 + 0x20) = pcVar7 + 8;
  pcVar7[0x28] = '\0';
  pcVar7[0x29] = '\0';
  pcVar7[0x2a] = '\0';
  pcVar7[0x2b] = '\0';
  pcVar7[0x2c] = '\0';
  pcVar7[0x2d] = '\0';
  pcVar7[0x2e] = '\0';
  pcVar7[0x2f] = '\0';
  ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar10 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar8 = ppVVar10[-1];
  uVar2 = *(ushort *)&pVVar8->field_0x8;
  *(ushort *)&pVVar8->field_0x8 = uVar2 & 0xff00 | 7;
  local_88.map_ = *(ObjectValues **)&pVVar8->value_;
  (pVVar8->value_).string_ = pcVar7;
  *(ushort *)&pVVar8->field_0x8 = uVar2 & 0xfe00 | 7;
  local_80 = uVar2 & 0x100 | uVar12 | uVar2 & 0xff;
  ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar10 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar10[-1]->start_ = (long)tokenStart->start_ - (long)this->begin_;
  do {
    readToken(this,&local_48);
    while (TVar4 = local_48.type_, local_48.type_ == tokenComment) {
      readToken(this,&local_48);
    }
    if ((local_48.type_ == tokenObjectEnd) && ((char *)local_a8._M_string_length == (char *)0x0)) {
LAB_0010f333:
      unaff_R13B = 1;
      iVar6 = 1;
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&local_a8,0,(char *)local_a8._M_string_length,0x122aed);
      iVar6 = 3;
      if (TVar4 == tokenNumber) {
        if ((this->features_).allowNumericKeys_ == true) {
          local_e8 = local_e8 & 0xfffffffffffffe00;
          local_e0._M_allocated_capacity = 0;
          local_e0._8_8_ = 0;
          local_d0 = 0;
          bVar5 = decodeNumber(this,&local_48,(Value *)&local_f0);
          if (bVar5) {
            Value::asString_abi_cxx11_(&local_c8,(Value *)&local_f0);
            std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint)local_c8._M_dataplus._M_p) !=
                &local_c8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_c8._M_dataplus._M_p._4_4_,
                                       (uint)local_c8._M_dataplus._M_p));
            }
          }
          else {
            recoverFromError(this,tokenObjectEnd);
            unaff_R13B = 0;
          }
          Value::~Value((Value *)&local_f0);
          iVar6 = 1;
          if (bVar5) goto LAB_0010f156;
        }
      }
      else if (TVar4 == tokenString) {
        bVar5 = decodeString(this,&local_48,&local_a8);
        if (bVar5) {
LAB_0010f156:
          readToken(this,&local_60);
          if (local_60.type_ == tokenMemberSeparator) {
            if ((char *)0x3fffffff < local_a8._M_string_length) {
              local_f0.string_ = (char *)&local_e0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,"keylength >= 2^30","");
              throwRuntimeError((string *)&local_f0);
            }
            if ((this->features_).rejectDupKeys_ == true) {
              ppVVar10 = (this->nodes_).c.
                         super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_cur;
              if (ppVVar10 ==
                  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVVar10 = (this->nodes_).c.
                           super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              pVVar8 = Value::find(ppVVar10[-1],local_a8._M_dataplus._M_p,
                                   (char *)(local_a8._M_string_length +
                                           (long)local_a8._M_dataplus._M_p));
              if (pVVar8 != (Value *)0x0) {
                std::operator+(&local_c8,"Duplicate key: \'",&local_a8);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_c8);
                local_f0.string_ = (char *)&local_e0;
                paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 == paVar11) {
                  local_e0._M_allocated_capacity = paVar11->_M_allocated_capacity;
                  local_e0._8_8_ = plVar9[3];
                }
                else {
                  local_e0._M_allocated_capacity = paVar11->_M_allocated_capacity;
                  local_f0.string_ = ((char *)*plVar9).string_;
                }
                local_e8 = plVar9[1];
                *plVar9 = (long)paVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint)local_c8._M_dataplus._M_p) !=
                    &local_c8.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_c8._M_dataplus._M_p._4_4_,
                                           (uint)local_c8._M_dataplus._M_p));
                }
                addError(this,(string *)&local_f0,&local_48,(Location)0x0);
                recoverFromError(this,tokenObjectEnd);
                goto LAB_0010f3de;
              }
            }
            ppVVar10 = (this->nodes_).c.
                       super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur;
            if (ppVVar10 ==
                (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVVar10 = (this->nodes_).c.
                         super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            local_f0.map_ =
                 (ObjectValues *)
                 Value::resolveReference
                           (ppVVar10[-1],local_a8._M_dataplus._M_p,
                            (char *)(local_a8._M_string_length + (long)local_a8._M_dataplus._M_p));
            pVVar3 = (ValueHolder *)
                     (this->nodes_).c.
                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (pVVar3 == (ValueHolder *)
                          ((this->nodes_).c.
                           super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_last + -1)) {
              std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                        ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,
                         (Value **)&local_f0.map_);
            }
            else {
              pVVar3->map_ = (ObjectValues *)local_f0;
              piVar1 = &(this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            bVar5 = readValue(this);
            std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                      ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
            if (!bVar5) {
              recoverFromError(this,tokenObjectEnd);
              goto LAB_0010f3f2;
            }
            readToken(this,(Token *)&local_c8);
            if (((uint)local_c8._M_dataplus._M_p < 0x10) &&
               ((0xa004U >> ((uint)local_c8._M_dataplus._M_p & 0x1f) & 1) != 0)) {
              while ((uint)local_c8._M_dataplus._M_p == 0xf) {
                readToken(this,(Token *)&local_c8);
              }
              if ((uint)local_c8._M_dataplus._M_p == 2) goto LAB_0010f333;
              iVar6 = 0;
              goto LAB_0010f3fa;
            }
            local_f0.string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"Missing \',\' or \'}\' in object declaration","");
            addError(this,(string *)&local_f0,(Token *)&local_c8,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          else {
            local_f0.string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"Missing \':\' after object member name","");
            addError(this,(string *)&local_f0,&local_60,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
LAB_0010f3de:
          if (local_f0 != &local_e0) {
            operator_delete(local_f0.string_);
          }
        }
        else {
          recoverFromError(this,tokenObjectEnd);
        }
LAB_0010f3f2:
        iVar6 = 1;
        unaff_R13B = 0;
      }
    }
LAB_0010f3fa:
    if (iVar6 != 0) {
      if (iVar6 == 3) {
        local_f0.string_ = (char *)&local_e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"Missing \'}\' or object member name","");
        addError(this,(string *)&local_f0,&local_48,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0.string_);
        }
        unaff_R13B = 0;
      }
      Value::~Value((Value *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      return (bool)(unaff_R13B & 1);
    }
  } while( true );
}

Assistant:

bool OurReader::readObject(Token& tokenStart) {
  Token tokenName;
  JSONCPP_STRING name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name = "";
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    if (name.length() >= (1U<<30)) throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      JSONCPP_STRING msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(
          msg, tokenName, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}